

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O2

void __thiscall InputGraph::set_vertex_name(InputGraph *this,int v,string_view l)

{
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var1;
  int iVar2;
  string_view name;
  allocator<char> local_85;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  int local_50 [2];
  string local_48 [32];
  
  local_60._M_str = l._M_str;
  local_60._M_len = l._M_len;
  name._M_str = "vertex name";
  name._M_len = (size_t)local_60._M_str;
  local_84 = v;
  anon_unknown.dwarf_1c963f::sanity_check_name
            ((anon_unknown_dwarf_1c963f *)local_60._M_len,name,local_60._M_str);
  boost::bimaps::container_adaptor::associative_container_adaptor<$73302351$>::erase<int>
            ((associative_container_adaptor<_73302351_> *)
             ((long)&((this->_imp)._M_t.
                      super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                      .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->vertex_names +
             0x98),&local_84);
  iVar2 = local_84;
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
       super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
       super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_80,&local_60,&local_85);
  local_50[0] = iVar2;
  std::__cxx11::string::string(local_48,&local_80);
  boost::multi_index::
  multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
  ::insert_<boost::multi_index::detail::lvalue_tag>
            ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
              *)((long)(*(hashed_index<_41bb0298_> **)
                         ((long)&(_Var1._M_head_impl)->vertex_names + 8) + 0xffffffffffffffff) +
                0x28),local_50);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

auto InputGraph::set_vertex_name(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex name");
    _imp->vertex_names.left.erase(v);
    _imp->vertex_names.insert(Names::value_type{v, string{l}});
}